

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimInfo.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall OpenMD::SimInfo::getGlobalGroupIndices(SimInfo *this)

{
  int iVar1;
  SimInfo *in_RSI;
  vector<int,_std::allocator<int>_> *in_RDI;
  CutoffGroup *cg;
  CutoffGroupIterator ci;
  Molecule *mol;
  MoleculeIterator mi;
  vector<int,_std::allocator<int>_> *GlobalGroupIndices;
  CutoffGroup *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  vector<int,_std::allocator<int>_> *i;
  CutoffGroup *local_30;
  __normal_iterator<OpenMD::CutoffGroup_**,_std::vector<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>_>
  local_28;
  Molecule *local_20;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_18 [3];
  
  i = in_RDI;
  std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(local_18);
  __gnu_cxx::
  __normal_iterator<OpenMD::CutoffGroup_**,_std::vector<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>_>
  ::__normal_iterator(&local_28);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x157368);
  local_20 = beginMolecule(in_RSI,(MoleculeIterator *)i);
  while (local_20 != (Molecule *)0x0) {
    local_30 = Molecule::beginCutoffGroup((Molecule *)in_RSI,(iterator *)i);
    while (local_30 != (CutoffGroup *)0x0) {
      iVar1 = CutoffGroup::getGlobalIndex(local_30);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)CONCAT44(iVar1,in_stack_ffffffffffffff90),
                 (value_type_conflict1 *)in_stack_ffffffffffffff88);
      in_stack_ffffffffffffff88 = Molecule::nextCutoffGroup((Molecule *)in_RSI,(iterator *)i);
      local_30 = in_stack_ffffffffffffff88;
    }
    local_20 = nextMolecule(in_RSI,(MoleculeIterator *)i);
  }
  return in_RDI;
}

Assistant:

vector<int> SimInfo::getGlobalGroupIndices() {
    SimInfo::MoleculeIterator mi;
    Molecule* mol;
    Molecule::CutoffGroupIterator ci;
    CutoffGroup* cg;

    vector<int> GlobalGroupIndices;

    for (mol = beginMolecule(mi); mol != NULL; mol = nextMolecule(mi)) {
      // local index of cutoff group is trivial, it only depends on the
      // order of travesing
      for (cg = mol->beginCutoffGroup(ci); cg != NULL;
           cg = mol->nextCutoffGroup(ci)) {
        GlobalGroupIndices.push_back(cg->getGlobalIndex());
      }
    }
    return GlobalGroupIndices;
  }